

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderLang.cpp
# Opt level: O0

void __thiscall glslang::TProgram::~TProgram(TProgram *this)

{
  TInfoSink *this_00;
  TIntermediate *this_01;
  TPoolAllocator *this_02;
  list<glslang::TShader_*,_std::allocator<glslang::TShader_*>_> *local_48;
  int local_14;
  int s;
  TProgram *this_local;
  
  this->_vptr_TProgram = (_func_int **)&PTR__TProgram_010d8380;
  this_00 = this->infoSink;
  if (this_00 != (TInfoSink *)0x0) {
    TInfoSink::~TInfoSink(this_00);
    ::operator_delete(this_00,0x60);
  }
  if (this->reflection != (TReflection *)0x0) {
    (*this->reflection->_vptr_TReflection[1])();
  }
  for (local_14 = 0; local_14 < 0xe; local_14 = local_14 + 1) {
    if (((this->newedIntermediate[local_14] & 1U) != 0) &&
       (this_01 = this->intermediate[local_14], this_01 != (TIntermediate *)0x0)) {
      TIntermediate::~TIntermediate(this_01);
      ::operator_delete(this_01,0x7e8);
    }
  }
  this_02 = this->pool;
  if (this_02 != (TPoolAllocator *)0x0) {
    TPoolAllocator::~TPoolAllocator(this_02);
    ::operator_delete(this_02,0x60);
  }
  local_48 = (list<glslang::TShader_*,_std::allocator<glslang::TShader_*>_> *)this->intermediate;
  do {
    local_48 = local_48 + -1;
    std::__cxx11::list<glslang::TShader_*,_std::allocator<glslang::TShader_*>_>::~list(local_48);
  } while (local_48 != this->stages);
  return;
}

Assistant:

TProgram::~TProgram()
{
    delete infoSink;
    delete reflection;

    for (int s = 0; s < EShLangCount; ++s)
        if (newedIntermediate[s])
            delete intermediate[s];

    delete pool;
}